

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O2

void rsg::computeRandomValueRange(GeneratorState *state,ValueRangeAccess valueRange)

{
  Type TVar1;
  deRandom *rnd;
  bool bVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  Exception *this;
  int ndx;
  int iVar6;
  float fVar7;
  StridedValueAccess<1> SVar8;
  allocator<char> local_69;
  Scalar *local_68;
  Scalar *local_60;
  string local_58;
  Scalar *local_38;
  
  rnd = &state->m_random->m_rnd;
  TVar1 = (valueRange.super_ConstValueRangeAccess.m_type)->m_baseType;
  if (TVar1 == TYPE_BOOL) {
    local_60 = valueRange.super_ConstValueRangeAccess.m_min;
    local_68 = valueRange.super_ConstValueRangeAccess.m_max;
    for (iVar6 = 0; iVar6 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements;
        iVar6 = iVar6 + 1) {
      bVar2 = de::Random::getBool((Random *)rnd);
      bVar3 = true;
      if (!bVar2) {
        bVar3 = de::Random::getBool((Random *)rnd);
      }
      local_58._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_58._M_string_length = (size_type)local_60;
      SVar8 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_58,iVar6);
      (SVar8.super_ConstStridedValueAccess<1>.m_value)->boolVal = bVar2;
      local_58._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_58._M_string_length = (size_type)local_68;
      SVar8 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_58,iVar6);
      (SVar8.super_ConstStridedValueAccess<1>.m_value)->boolVal = bVar3;
    }
  }
  else if (TVar1 == TYPE_INT) {
    local_60 = valueRange.super_ConstValueRangeAccess.m_min;
    local_68 = valueRange.super_ConstValueRangeAccess.m_max;
    for (iVar6 = 0; iVar6 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements;
        iVar6 = iVar6 + 1) {
      dVar4 = deRandom_getUint32(rnd);
      iVar5 = de::Random::getInt((Random *)rnd,0,0x20 - dVar4 % 0x21);
      local_58._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_58._M_string_length = (size_type)local_60;
      SVar8 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_58,iVar6);
      (SVar8.super_ConstStridedValueAccess<1>.m_value)->intVal = iVar5 + -0x10;
      local_58._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_58._M_string_length = (size_type)local_68;
      SVar8 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_58,iVar6);
      (SVar8.super_ConstStridedValueAccess<1>.m_value)->intVal = dVar4 % 0x21 + iVar5 + -0x10;
    }
  }
  else {
    if (TVar1 != TYPE_FLOAT) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"computeRandomValueRange(): Unsupported type",&local_69);
      Exception::Exception(this,&local_58);
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_38 = valueRange.super_ConstValueRangeAccess.m_min;
    for (iVar6 = 0; iVar6 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements;
        iVar6 = iVar6 + 1) {
      dVar4 = deRandom_getUint32(rnd);
      iVar5 = de::Random::getInt((Random *)rnd,0,0x140 - dVar4 % 0x141);
      fVar7 = (float)iVar5 * 0.1 + -16.0;
      local_68 = (Scalar *)CONCAT44(local_68._4_4_,fVar7);
      local_60 = (Scalar *)CONCAT44(local_60._4_4_,(float)(dVar4 % 0x141) * 0.1 + fVar7);
      local_58._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_58._M_string_length = (size_type)local_38;
      SVar8 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_58,iVar6);
      (SVar8.super_ConstStridedValueAccess<1>.m_value)->intVal = (int)local_68;
      local_58._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_58._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_max;
      SVar8 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_58,iVar6);
      (SVar8.super_ConstStridedValueAccess<1>.m_value)->intVal = (int)local_60;
    }
  }
  return;
}

Assistant:

void computeRandomValueRange (GeneratorState& state, ValueRangeAccess valueRange)
{
	const VariableType&	type	= valueRange.getType();
	de::Random&			rnd		= state.getRandom();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				bool minVal = rnd.getBool();
				bool maxVal = minVal ? true : rnd.getBool();
				valueRange.getMin().component(ndx).asBool() = minVal;
				valueRange.getMax().component(ndx).asBool() = maxVal;
			}
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const int minIntVal		= -16;
				const int maxIntVal		=  16;
				const int maxRangeLen	= maxIntVal - minIntVal;

				int rangeLen	= rnd.getInt(0, maxRangeLen);
				int minVal		= minIntVal + rnd.getInt(0, maxRangeLen-rangeLen);
				int maxVal		= minVal + rangeLen;

				valueRange.getMin().component(ndx).asInt() = minVal;
				valueRange.getMax().component(ndx).asInt() = maxVal;
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const float step			= 0.1f;
				const int	maxSteps		= 320;
				const float minFloatVal		= -16.0f;

				int rangeLen	= rnd.getInt(0, maxSteps);
				int minStep		= rnd.getInt(0, maxSteps-rangeLen);

				float minVal	= minFloatVal + step*(float)minStep;
				float maxVal	= minVal + step*(float)rangeLen;

				valueRange.getMin().component(ndx).asFloat() = minVal;
				valueRange.getMax().component(ndx).asFloat() = maxVal;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("computeRandomValueRange(): Unsupported type");
	}
}